

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineComputer.cxx
# Opt level: O0

string * __thiscall
cmLinkLineComputer::ComputeLinkLibraries
          (string *__return_storage_ptr__,cmLinkLineComputer *this,cmComputeLinkInformation *cli,
          string *stdLibString)

{
  ulong uVar1;
  string *psVar2;
  ostream *poVar3;
  string local_230;
  undefined1 local_210 [8];
  string rpath_link;
  string local_1c0;
  undefined1 local_1a0 [8];
  ostringstream fout;
  string *stdLibString_local;
  cmComputeLinkInformation *cli_local;
  cmLinkLineComputer *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  ComputeRPath_abi_cxx11_(&local_1c0,this,cli);
  std::operator<<((ostream *)local_1a0,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  ComputeLinkLibs_abi_cxx11_((string *)((long)&rpath_link.field_2 + 8),this,cli);
  std::operator<<((ostream *)local_1a0,(string *)(rpath_link.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(rpath_link.field_2._M_local_buf + 8));
  cmComputeLinkInformation::GetRPathLinkString_abi_cxx11_((string *)local_210,cli);
  cmComputeLinkInformation::GetRPathLinkFlag_abi_cxx11_(cli);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      psVar2 = cmComputeLinkInformation::GetRPathLinkFlag_abi_cxx11_(cli);
      std::operator<<((ostream *)local_1a0,(string *)psVar2);
      cmOutputConverter::EscapeForShell
                (&local_230,this->OutputConverter,(string *)local_210,(bool)(~this->ForResponse & 1)
                 ,false,false);
      std::operator<<((ostream *)local_1a0,(string *)&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      std::operator<<((ostream *)local_1a0," ");
    }
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)local_1a0,(string *)stdLibString);
    std::operator<<(poVar3," ");
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::~string((string *)local_210);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLinkLineComputer::ComputeLinkLibraries(
  cmComputeLinkInformation& cli, std::string const& stdLibString)
{
  std::ostringstream fout;
  fout << this->ComputeRPath(cli);

  // Write the library flags to the build rule.
  fout << this->ComputeLinkLibs(cli);

  // Add the linker runtime search path if any.
  std::string rpath_link = cli.GetRPathLinkString();
  if (!cli.GetRPathLinkFlag().empty() && !rpath_link.empty()) {
    fout << cli.GetRPathLinkFlag();
    fout << this->OutputConverter->EscapeForShell(rpath_link,
                                                  !this->ForResponse);
    fout << " ";
  }

  if (!stdLibString.empty()) {
    fout << stdLibString << " ";
  }

  return fout.str();
}